

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.h
# Opt level: O0

string * __thiscall fs::path::utf8string_abi_cxx11_(path *this)

{
  const_iterator __beg;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_RDI;
  long in_FS_OFFSET;
  u8string *utf8_str;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
  *in_stack_ffffffffffffff68;
  allocator<char> *__a;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *this_00;
  path *in_stack_ffffffffffffff98;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  in_stack_ffffffffffffffa0;
  allocator<char> local_29;
  allocator<char> local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = local_28;
  this_00 = in_RDI;
  std::filesystem::__cxx11::path::u8string_abi___u8_(in_stack_ffffffffffffff98);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::begin
            (in_stack_ffffffffffffff68);
  __beg = std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
          end(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              )__beg._M_current,in_stack_ffffffffffffffa0,__a);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::u8string::~u8string(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (string *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string utf8string() const
    {
        const std::u8string& utf8_str{std::filesystem::path::u8string()};
        return std::string{utf8_str.begin(), utf8_str.end()};
    }